

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O1

void sysbvm_jit_makeByteArray
               (sysbvm_bytecodeJit_t *jit,int16_t resultOperand,size_t elementCount,
               int16_t *elementOperands)

{
  long lVar1;
  int32_t iVar2;
  sysbvm_x86_register_t extraout_EDX;
  sysbvm_x86_register_t extraout_EDX_00;
  sysbvm_x86_register_t reg;
  size_t byteCount;
  size_t sVar3;
  uint8_t instruction [3];
  undefined4 local_37;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  size_t local_30;
  
  if (-1 < resultOperand) {
    iVar2 = jit->contextPointerOffset;
    local_37 = CONCAT13((char)iVar2,0xbd8b48);
    local_33 = (undefined1)((uint)iVar2 >> 8);
    local_32 = (undefined1)((uint)iVar2 >> 0x10);
    local_31 = (undefined1)((uint)iVar2 >> 0x18);
    local_30 = elementCount;
    sysbvm_bytecodeJit_addBytes(jit,7,(uint8_t *)&local_37);
    local_37 = CONCAT13((char)local_30,0xc6c748);
    local_33 = (undefined1)(local_30 >> 8);
    local_32 = (undefined1)(local_30 >> 0x10);
    local_31 = (undefined1)(local_30 >> 0x18);
    sysbvm_bytecodeJit_addBytes(jit,7,(uint8_t *)&local_37);
    sysbvm_jit_x86_call(jit,sysbvm_byteArray_create);
    reg = extraout_EDX;
    if (local_30 != 0) {
      sVar3 = 0;
      do {
        sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG2,elementOperands[sVar3]);
        local_37 = 0x4eac148;
        sysbvm_bytecodeJit_addBytes(jit,4,(uint8_t *)&local_37);
        if ((int)sVar3 == -0x10) {
          local_37 = CONCAT13(local_37._3_1_,0x108848);
          byteCount = 3;
        }
        else {
          lVar1 = sVar3 + 0x10;
          local_37 = CONCAT13((char)sVar3 + '\x10',0x908848);
          local_33 = (undefined1)((ulong)lVar1 >> 8);
          local_32 = (undefined1)((ulong)lVar1 >> 0x10);
          local_31 = (undefined1)((ulong)lVar1 >> 0x18);
          byteCount = 7;
        }
        sysbvm_bytecodeJit_addBytes(jit,byteCount,(uint8_t *)&local_37);
        sVar3 = sVar3 + 1;
        reg = extraout_EDX_00;
      } while (local_30 != sVar3);
    }
    sysbvm_jit_moveRegisterToOperand(jit,resultOperand,reg);
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_makeByteArray(sysbvm_bytecodeJit_t *jit, int16_t resultOperand, size_t elementCount, int16_t *elementOperands)
{
    if(resultOperand < 0)
        return;

    sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);
    sysbvm_jit_x86_movImmediate32(jit, SYSBVM_X86_64_ARG1, (int32_t)elementCount);
    sysbvm_jit_x86_call(jit, &sysbvm_byteArray_create);

    for(size_t i = 0; i < elementCount; ++i)
    {
        sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG2, elementOperands[i]);
        sysbvm_jit_x86_logicalShiftRightImmediate(jit, SYSBVM_X86_64_ARG2, SYSBVM_TUPLE_TAG_BIT_COUNT);
        sysbvm_jit_x86_mov8IntoMemoryWithOffset(jit, SYSBVM_X86_RAX, (int32_t) (sizeof(sysbvm_tuple_header_t) + i), SYSBVM_X86_64_ARG2);
    }

    sysbvm_jit_moveRegisterToOperand(jit, resultOperand, SYSBVM_X86_RAX);
}